

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::UniversalPrinter<std::tuple<int,_BasicTestExpr<1>_>_>::Print
               (tuple<int,_BasicTestExpr<1>_> *value,ostream *os)

{
  tuple<int,_BasicTestExpr<1>_> *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  PrintTo<int,BasicTestExpr<1>>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }